

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void musig_test_set_secnonce
               (secp256k1_musig_secnonce *secnonce,uchar *secnonce64,secp256k1_pubkey *pubkey)

{
  int iVar1;
  secp256k1_scalar k [2];
  secp256k1_ge pk;
  secp256k1_pubkey *in_stack_ffffffffffffff48;
  secp256k1_ge *in_stack_ffffffffffffff50;
  secp256k1_context *in_stack_ffffffffffffff58;
  secp256k1_scalar *in_stack_ffffffffffffff60;
  
  secp256k1_scalar_set_b32
            (in_stack_ffffffffffffff60,(uchar *)in_stack_ffffffffffffff58,
             (int *)in_stack_ffffffffffffff50);
  secp256k1_scalar_set_b32
            (in_stack_ffffffffffffff60,(uchar *)in_stack_ffffffffffffff58,
             (int *)in_stack_ffffffffffffff50);
  iVar1 = secp256k1_pubkey_load
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/musig/tests_impl.h"
            ,0x35c,"test condition failed: secp256k1_pubkey_load(CTX, &pk, pubkey)");
    abort();
  }
  secp256k1_musig_secnonce_save
            ((secp256k1_musig_secnonce *)in_stack_ffffffffffffff50,
             (secp256k1_scalar *)in_stack_ffffffffffffff48,(secp256k1_ge *)0x167ba6);
  return;
}

Assistant:

static void musig_test_set_secnonce(secp256k1_musig_secnonce *secnonce, const unsigned char *secnonce64, const secp256k1_pubkey *pubkey) {
    secp256k1_ge pk;
    secp256k1_scalar k[2];

    secp256k1_scalar_set_b32(&k[0], &secnonce64[0], NULL);
    secp256k1_scalar_set_b32(&k[1], &secnonce64[32], NULL);
    CHECK(secp256k1_pubkey_load(CTX, &pk, pubkey));
    secp256k1_musig_secnonce_save(secnonce, k, &pk);
}